

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

longlong NULLC::StrToLong(NULLCArray str)

{
  char cVar1;
  int iVar2;
  long local_48;
  unsigned_long_long res;
  char *pcStack_38;
  bool negative;
  char *p;
  NULLCArray str_local;
  
  pcStack_38 = str.ptr;
  if (pcStack_38 == (char *)0x0) {
    str_local._4_8_ = 0;
  }
  else {
    cVar1 = *pcStack_38;
    if (cVar1 == '-') {
      pcStack_38 = pcStack_38 + 1;
    }
    local_48 = 0;
    for (; (int)*pcStack_38 - 0x30U < 10; pcStack_38 = pcStack_38 + 1) {
      local_48 = local_48 * 10 + (ulong)((int)*pcStack_38 - 0x30);
    }
    iVar2 = 1;
    if (cVar1 == '-') {
      iVar2 = -1;
    }
    str_local._4_8_ = local_48 * iVar2;
  }
  return str_local._4_8_;
}

Assistant:

long long NULLC::StrToLong(NULLCArray str)
{
	if(!str.ptr)
		return 0;

	const char *p = str.ptr;

	bool negative = *p == '-';
	if(negative)
		p++;

	unsigned long long res = 0;
	while(unsigned(*p - '0') < 10)
		res = res * 10 + unsigned(*p++ - '0');

	return res * (negative ? -1 : 1);
}